

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

void __thiscall Pda::addNode(Pda *this,string *name,bool start,bool end)

{
  Node *this_00;
  Node *n;
  Node *local_50;
  string local_48;
  
  this_00 = (Node *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  Tjen::Node::Node(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_50 = this_00;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back(&this->allNodes,&local_50);
  if (start) {
    this->start = local_50;
  }
  if (end) {
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back(&this->endNodes,&local_50);
  }
  return;
}

Assistant:

void Pda::addNode(std::string name, bool start, bool end) {
    Tjen::Node * n = new Tjen::Node(name);
    this->allNodes.push_back(n);

    if(start){
        this->start = n;
    }
    if(end){
        this->endNodes.push_back(n);
    }
}